

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.h
# Opt level: O0

shared_ptr<const_Rml::FilterDeclarationList> __thiscall
Rml::Property::Get<std::shared_ptr<Rml::FilterDeclarationList_const>>(Property *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_Rml::FilterDeclarationList> *in_RSI;
  shared_ptr<const_Rml::FilterDeclarationList> sVar1;
  shared_ptr<const_Rml::FilterDeclarationList> local_28;
  Property *this_local;
  
  this_local = this;
  ::std::shared_ptr<const_Rml::FilterDeclarationList>::shared_ptr(&local_28);
  Variant::Get<std::shared_ptr<Rml::FilterDeclarationList_const>>(&this->value,in_RSI);
  ::std::shared_ptr<const_Rml::FilterDeclarationList>::~shared_ptr(&local_28);
  sVar1.super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Rml::FilterDeclarationList>)
         sVar1.super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

T Get() const
	{
		return value.Get<T>();
	}